

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall DStrifeStatusBar::DrawPopScreen(DStrifeStatusBar *this,int bottom)

{
  int iVar1;
  player_t *ppVar2;
  int iVar3;
  int iVar4;
  DFrameBuffer *pDVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  FTexture *pFVar9;
  ulong uVar10;
  FBrokenLines *lines;
  AInventory *pAVar11;
  PClassActor *type;
  APlayerPawn *pAVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  FString *pFVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  uint local_c0;
  FName local_a4;
  ulong local_a0;
  DFrameBuffer *local_98;
  ulong local_90;
  char *local_88;
  FName local_7c;
  char buff [64];
  
  pDVar5 = screen;
  iVar4 = CleanYfac;
  iVar3 = CleanXfac;
  uVar13 = (uint)(this->CurrentPop == 3);
  local_c0 = uVar13 ^ 5;
  uVar7 = (int)((double)this->PopHeightChange * r_TicFracF) + this->PopHeight;
  uVar7 = (int)uVar7 >> 0x1f & uVar7;
  uVar16 = 0xffffff98;
  if (-0x68 < (int)uVar7) {
    uVar16 = uVar7;
  }
  iVar21 = CleanXfac * -0xa0 + (screen->super_DSimpleCanvas).super_DCanvas.Width / 2;
  iVar17 = uVar16 * CleanYfac + bottom;
  pFVar9 = FImageCollection::operator[](&this->Images,uVar13 ^ 7);
  iVar22 = 0;
  DCanvas::DrawTexture
            ((DCanvas *)pDVar5,pFVar9,(double)iVar21,(double)iVar17,0x40001393,0x3fe8000000000000,1,
             0x4000138c,0);
  pDVar5 = screen;
  pFVar9 = FImageCollection::operator[](&this->Images,local_c0);
  DCanvas::DrawTexture((DCanvas *)pDVar5,pFVar9,(double)iVar21,(double)iVar17,0x40001393,1,0);
  iVar14 = this->CurrentPop;
  if (iVar14 == 3) {
    iVar8 = iVar3 * 0x10c + iVar21;
    iVar14 = iVar3 * 7;
    DrINumber2(this,(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy,iVar8,
               iVar4 * 0x1c + iVar17,iVar14,0x13);
    DrINumber2(this,(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina,iVar8,
               iVar4 * 0x34 + iVar17,iVar14,0x13);
    pAVar12 = ((this->super_DBaseStatusBar).CPlayer)->mo;
    while( true ) {
      pAVar12 = (APlayerPawn *)
                GC::ReadBarrier<AInventory>((AInventory **)&(pAVar12->super_AActor).Inventory);
      if (pAVar12 == (APlayerPawn *)0x0) break;
      bVar6 = DObject::IsKindOf((DObject *)pAVar12,AKey::RegistrationInfo.MyClass);
      iVar22 = iVar22 + (uint)bVar6;
    }
    DrINumber2(this,iVar22,iVar8,iVar4 * 0x4c + iVar17,iVar14,0x13);
    local_7c.Index = 0x113;
    pAVar11 = AActor::FindInventory
                        (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,&local_7c);
    pDVar5 = screen;
    if (pAVar11 != (AInventory *)0x0) {
      pFVar9 = FTextureManager::operator()(&TexMan,(FTextureID)(pAVar11->Icon).texnum,false);
      DCanvas::DrawTexture
                ((DCanvas *)pDVar5,pFVar9,(double)(iVar3 * 0x118 + iVar21),
                 (double)(iVar4 * 0x4a + iVar17),0x40001393,1,0);
    }
    iVar22 = iVar3 * 0xce + iVar21;
    for (lVar23 = 0; lVar23 != 7; lVar23 = lVar23 + 1) {
      type = PClass::FindActor(DrawPopScreen::AmmoList[lVar23].AmmoType);
      pAVar11 = AActor::FindInventory
                          (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,type,false);
      if (pAVar11 == (AInventory *)0x0) {
        iVar8 = DrawPopScreen::AmmoList[lVar23].Y * iVar4 + iVar17;
        DrINumber2(this,0,iVar22,iVar8,iVar14,0x13);
        pAVar11 = (AInventory *)(type->super_PClass).Defaults;
      }
      else {
        iVar8 = DrawPopScreen::AmmoList[lVar23].Y * iVar4 + iVar17;
        DrINumber2(this,pAVar11->Amount,iVar22,iVar8,iVar14,0x13);
      }
      DrINumber2(this,pAVar11->MaxAmount,iVar3 * 0xef + iVar21,iVar8,iVar14,0x13);
    }
    for (lVar23 = 8; lVar23 != 0x50; lVar23 = lVar23 + 0xc) {
      local_a4.Index = *(int *)(&UNK_005e69d8 + lVar23);
      pAVar11 = AActor::FindInventory
                          (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,&local_a4);
      pDVar5 = screen;
      if (pAVar11 != (AInventory *)0x0) {
        pFVar9 = FTextureManager::operator()(&TexMan,(FTextureID)(pAVar11->Icon).texnum,false);
        DCanvas::DrawTexture
                  ((DCanvas *)pDVar5,pFVar9,
                   (double)(*(int *)(&UNK_005e69dc + lVar23) * iVar3 + iVar21),
                   (double)(*(int *)((long)&DrawPopScreen::WeaponList[0].TypeName + lVar23) * iVar4
                           + iVar17),0x40001393,1,0x4000139c,0,0x4000139b,0,0);
      }
    }
  }
  else if (iVar14 == 2) {
    iVar14 = this->KeyPopPos;
    if (this->KeyPopScroll < 1) {
      iVar22 = 0x14;
      iVar8 = iVar14;
    }
    else {
      iVar8 = this->KeyPopScroll - (int)(r_TicFracF * 25.454545454545453);
      iVar22 = 0;
      if (0 < iVar8) {
        iVar22 = iVar8;
      }
      iVar22 = iVar22 + -0x104;
      iVar8 = iVar14 + -10;
    }
    uVar20 = (ulong)(uint)(iVar3 * 0x11 + iVar21);
    uVar10 = (ulong)(uint)(iVar3 * 0x12f + iVar21);
    pAVar12 = ((this->super_DBaseStatusBar).CPlayer)->mo;
    iVar15 = 0;
    while( true ) {
      pAVar12 = (APlayerPawn *)
                GC::ReadBarrier<AInventory>((AInventory **)&(pAVar12->super_AActor).Inventory);
      if ((pAVar12 == (APlayerPawn *)0x0) || (iVar14 + 10 <= iVar15)) break;
      bVar6 = DObject::IsKindOf((DObject *)pAVar12,AKey::RegistrationInfo.MyClass);
      if (bVar6) {
        if (iVar8 <= iVar15) {
          local_88 = AActor::GetTag((AActor *)pAVar12,(char *)0x0);
          iVar1 = this->KeyPopScroll;
          iVar18 = (iVar15 % 5) * 0x12;
          local_98 = screen;
          local_a0 = uVar20;
          pFVar9 = FTextureManager::operator()
                             (&TexMan,(FTextureID)*(int *)&(pAVar12->InvSel).field_0,false);
          uVar13 = ((uint)(0 < iVar1) * 2 + 1 & (iVar15 - iVar8) / 5) * 0x8c;
          local_90 = (ulong)uVar13;
          DCanvas::DrawTexture
                    ((DCanvas *)local_98,pFVar9,(double)(int)((iVar22 + uVar13) * iVar3 + iVar21),
                     (double)((iVar18 + 6) * iVar4 + iVar17),0x40001393,1,0x400013a3,local_a0,
                     0x400013a4,uVar10,0);
          uVar20 = local_a0;
          DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,
                            ((int)local_90 + iVar22 + 0x11) * iVar3 + iVar21,
                            (iVar18 + 0xb) * iVar4 + iVar17,local_88,0x40001393,1,0x400013a3,
                            local_a0,0x400013a4,uVar10,0);
        }
        iVar15 = iVar15 + 1;
      }
    }
  }
  else if (iVar14 == 1) {
    uVar10 = ((long)level.time * 0x62) / 0xdac;
    uVar13 = (int)uVar10 >> 0x1f;
    uVar20 = (ulong)uVar13 << 0x20 | uVar10 & 0xffffffff;
    mysnprintf(buff,0x40,"%02d:%02d:%02d",(long)uVar20 / 0xe10 & 0xffffffff,
               (ulong)(uint)(int)(short)((short)((long)uVar20 % 0xe10) / 0x3c),
               (long)((ulong)uVar13 << 0x20 | uVar10 & 0xffffffff) % 0x3c & 0xffffffff);
    DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,iVar3 * 0xd2 + iVar21,iVar17 + iVar4 * 8,buff
                      ,0x40001393,1,0);
    ppVar2 = (this->super_DBaseStatusBar).CPlayer;
    if (*(int *)((ppVar2->LogText).Chars + -0xc) != 0) {
      lines = V_BreakLines(SmallFont2,0x110,&ppVar2->LogText,false);
      iVar14 = bottom + (uVar16 + 0x12) * iVar4;
      for (pFVar19 = &lines->Text; -1 < ((FBrokenLines *)(pFVar19 + -1))->Width;
          pFVar19 = pFVar19 + 2) {
        DCanvas::DrawText((DCanvas *)screen,SmallFont2,0xb,iVar21 + iVar3 * 0x18,iVar14,
                          pFVar19->Chars,0x40001393,1,0);
        iVar14 = iVar14 + iVar4 * 0xc;
      }
      V_FreeBrokenLines(lines);
    }
  }
  return;
}

Assistant:

void DrawPopScreen (int bottom)
	{
		char buff[64];
		const char *label;
		int i;
		AInventory *item;
		int xscale, yscale, left, top;
		int bars = (CurrentPop == POP_Status) ? imgINVPOP : imgINVPOP2;
		int back = (CurrentPop == POP_Status) ? imgINVPBAK : imgINVPBAK2;
		// Extrapolate the height of the popscreen for smoother movement
		int height = clamp<int> (PopHeight + int(r_TicFracF * PopHeightChange), -POP_HEIGHT, 0);

		xscale = CleanXfac;
		yscale = CleanYfac;
		left = screen->GetWidth()/2 - 160*CleanXfac;
		top = bottom + height * yscale;

		screen->DrawTexture (Images[back], left, top, DTA_CleanNoMove, true, DTA_AlphaF, 0.75, TAG_DONE);
		screen->DrawTexture (Images[bars], left, top, DTA_CleanNoMove, true, TAG_DONE);


		switch (CurrentPop)
		{
		case POP_Log:
		{
			int seconds = Tics2Seconds(level.time);
			// Draw the latest log message.
			mysnprintf(buff, countof(buff), "%02d:%02d:%02d",
				seconds / 3600,
				(seconds % 3600) / 60,
				(seconds) % 60);

			screen->DrawText(SmallFont2, CR_UNTRANSLATED, left + 210 * xscale, top + 8 * yscale, buff,
				DTA_CleanNoMove, true, TAG_DONE);

			if (CPlayer->LogText.IsNotEmpty())
			{
				FBrokenLines *lines = V_BreakLines(SmallFont2, 272, CPlayer->LogText);
				for (i = 0; lines[i].Width >= 0; ++i)
				{
					screen->DrawText(SmallFont2, CR_UNTRANSLATED, left + 24 * xscale, top + (18 + i * 12)*yscale,
						lines[i].Text, DTA_CleanNoMove, true, TAG_DONE);
				}
				V_FreeBrokenLines(lines);
			}
			break;
		}

		case POP_Keys:
			// List the keys the player has.
			int pos, endpos, leftcol;
			int clipleft, clipright;
			
			pos = KeyPopPos;
			endpos = pos + 10;
			leftcol = 20;
			clipleft = left + 17*xscale;
			clipright = left + (320-17)*xscale;
			if (KeyPopScroll > 0)
			{
				// Extrapolate the scroll position for smoother scrolling
				int scroll = MAX<int> (0,KeyPopScroll - int(r_TicFracF * (280./KEY_TIME)));
				pos -= 10;
				leftcol = leftcol - 280 + scroll;
			}
			for (i = 0, item = CPlayer->mo->Inventory;
				i < endpos && item != NULL;
				item = item->Inventory)
			{
				if (!item->IsKindOf (RUNTIME_CLASS(AKey)))
					continue;
				
				if (i < pos)
				{
					i++;
					continue;
				}

				label = item->GetTag();

				int colnum = ((i-pos) / 5) & (KeyPopScroll > 0 ? 3 : 1);
				int rownum = (i % 5) * 18;

				screen->DrawTexture (TexMan(item->Icon),
					left + (colnum * 140 + leftcol)*xscale,
					top + (6 + rownum)*yscale,
					DTA_CleanNoMove, true,
					DTA_ClipLeft, clipleft,
					DTA_ClipRight, clipright,
					TAG_DONE);
				screen->DrawText (SmallFont2, CR_UNTRANSLATED,
					left + (colnum * 140 + leftcol + 17)*xscale,
					top + (11 + rownum)*yscale,
					label,
					DTA_CleanNoMove, true,
					DTA_ClipLeft, clipleft,
					DTA_ClipRight, clipright,
					TAG_DONE);
				i++;
			}
			break;

		case POP_Status:
			// Show miscellaneous status items.
			
			// Print stats
			DrINumber2 (CPlayer->mo->accuracy, left+268*xscale, top+28*yscale, 7*xscale, imgFONY0);
			DrINumber2 (CPlayer->mo->stamina, left+268*xscale, top+52*yscale, 7*xscale, imgFONY0);

			// How many keys does the player have?
			for (i = 0, item = CPlayer->mo->Inventory;
				item != NULL;
				item = item->Inventory)
			{
				if (item->IsKindOf (RUNTIME_CLASS(AKey)))
				{
					i++;
				}
			}
			DrINumber2 (i, left+268*xscale, top+76*yscale, 7*xscale, imgFONY0);

			// Does the player have a communicator?
			item = CPlayer->mo->FindInventory (NAME_Communicator);
			if (item != NULL)
			{
				screen->DrawTexture (TexMan(item->Icon),
					left + 280*xscale,
					top + 74*yscale,
					DTA_CleanNoMove, true, TAG_DONE);
			}

			// How much ammo does the player have?
			static const struct
			{
				ENamedName AmmoType;
				int Y;
			} AmmoList[7] =
			{
				{ NAME_ClipOfBullets,			19 },
				{ NAME_PoisonBolts,				35 },
				{ NAME_ElectricBolts,			43 },
				{ NAME_HEGrenadeRounds,			59 },
				{ NAME_PhosphorusGrenadeRounds,	67 },
				{ NAME_MiniMissiles,			75 },
				{ NAME_EnergyPod,				83 }
			};
			for (i = 0; i < 7; ++i)
			{
				PClassActor *ammotype = PClass::FindActor(AmmoList[i].AmmoType);
				item = CPlayer->mo->FindInventory (ammotype);

				if (item == NULL)
				{
					DrINumber2 (0, left+206*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
					DrINumber2 (((AInventory *)GetDefaultByType (ammotype))->MaxAmount,
						left+239*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
				}
				else
				{
					DrINumber2 (item->Amount, left+206*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
					DrINumber2 (item->MaxAmount, left+239*xscale, top+AmmoList[i].Y*yscale, 7*xscale, imgFONY0);
				}
			}

			// What weapons does the player have?
			static const struct
			{
				ENamedName TypeName;
				int X, Y;
			} WeaponList[6] =
			{
				{ NAME_StrifeCrossbow,			23, 19 },
				{ NAME_AssaultGun,				21, 41 },
				{ NAME_FlameThrower,			57, 50 },
				{ NAME_MiniMissileLauncher,		20, 64 },
				{ NAME_StrifeGrenadeLauncher,	55, 20 },
				{ NAME_Mauler,					52, 75 },
			};
			for (i = 0; i < 6; ++i)
			{
				item = CPlayer->mo->FindInventory (WeaponList[i].TypeName);

				if (item != NULL)
				{
					screen->DrawTexture (TexMan(item->Icon),
						left + WeaponList[i].X*xscale,
						top + WeaponList[i].Y*yscale,
						DTA_CleanNoMove, true,
						DTA_LeftOffset, 0,
						DTA_TopOffset, 0,
						TAG_DONE);
				}
			}
			break;
		}
	}